

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void sbc_E9(void)

{
  except = '\0';
  temp1 = getbyte(pc);
  _AL = acc;
  _AH = temp1;
  ovr_f = '\0';
  carry_f = '\x01';
  pc = pc + 1;
  return;
}

Assistant:

void sbc_E9(void) {
    uint flags;
    uint answer;
    CLE;
    temp1 = getbyte(pc);

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("sbb AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("push AX");
    asm("pop answer");
    asm("pop AX");

    result_f = acc = answer;
    (flags & 0x800) ? (ovr_f = 1) : (ovr_f = 0);
    carry_f = (flags & 1) ^ 1;

    pc++;
}